

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ViewState.cpp
# Opt level: O0

void __thiscall ViewState::handle_message(ViewState *this,Message *msg,Node *node)

{
  network_address_t nVar1;
  size_t sVar2;
  undefined1 local_b8 [8];
  Block bNew;
  Node *node_local;
  Message *msg_local;
  ViewState *this_local;
  
  bNew._144_8_ = node;
  switch(this->_state) {
  case SEND_TRANS:
    msg->msg_type = CONFIRM;
    nVar1 = Node::GetNodeAdd(node);
    msg->i = nVar1;
    sVar2 = Node::GetTransNum((Node *)bNew._144_8_);
    msg->n = sVar2;
    Node::SendAll((Node *)bNew._144_8_,msg);
    nVar1 = Node::GetNodeAdd((Node *)bNew._144_8_);
    if (nVar1 == 2) {
      this->_state = COMFIRM_TRANS;
    }
    else {
      this->_state = WAIT_BLOCK;
    }
    break;
  case COMFIRM_TRANS:
    if (msg->msg_type == CONFIRM) {
      this->accepted_confirm = this->accepted_confirm + 1;
    }
    if (this->accepted_confirm == 2) {
      Node::TransToCache(node,msg);
      Node::SealTrans((Block *)local_b8,(Node *)bNew._144_8_);
      if ((msg->n + 1) % 400 == 0) {
        Node::SendBlock((Node *)bNew._144_8_,(Block *)local_b8);
        Node::SendUnpack((Node *)bNew._144_8_,msg);
        this->_state = SEND_BLOCK;
      }
      else {
        this->_state = WAIT_BLOCK;
      }
      Block::~Block((Block *)local_b8);
    }
    break;
  case WAIT_BLOCK:
    if (msg->msg_type == UNPACK) {
      Node::GetOutBk(node);
    }
    break;
  case SEND_BLOCK:
  }
  return;
}

Assistant:

void ViewState::handle_message(Message msg, Node & node) {
  switch (_state) {
  case SEND_TRANS: {
    // TODO：主节点验证客户端请求消息签名是否正确，如果正确，则
    msg.msg_type = Message::CONFIRM;
    msg.i = node.GetNodeAdd();
    msg.n = node.GetTransNum();
    node.SendAll(msg);
    if (node.GetNodeAdd() == 2)
      _state = COMFIRM_TRANS;
    else {
      _state = WAIT_BLOCK;
    }
  }
  break;
  case WAIT_BLOCK:
  {
    if (msg.msg_type == Message::UNPACK)
    {
      //std::cout << "节点：" << node.GetNodeAdd() <<" 添加区块。"<<std::endl;
      node.GetOutBk();
    }

  }
  break;
  case COMFIRM_TRANS: {
    // TODO：副本节点验证
    //  a. 主节点PRE-PREPARE消息签名是否正确。
    //  b. 当前副本节点是否已经收到了一条在同一v下并且编号也是n，但是签名不同的PRE-PREPARE信息。
    //  c. d与m的摘要是否一致。
    //  d. n是否在区间[h, H]内。
    //  如果正确，则

    if (msg.msg_type == Message::CONFIRM) {
      accepted_confirm++;
    }
    if (accepted_confirm == k_value) // TODO:K_CA
    {
        //std::cout << "节点：" << node.GetNodeAdd() << " 达到k确认！"
                  //<< std::endl;
        node.TransToCache(msg);
        Block bNew = node.SealTrans();
        if ((msg.n+1)%400 == 0)
        {
          node.SendBlock(bNew);
          node.SendUnpack(msg);
          _state = SEND_BLOCK;
        }
        else
          _state = WAIT_BLOCK;
    }
  }
  break;
  case SEND_BLOCK:
    break;
  }
}